

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

bool DeploymentActiveAfter<Consensus::BuriedDeployment>
               (CBlockIndex *pindexPrev,ChainstateManager *chainman,BuriedDeployment dep)

{
  CChainParams *pCVar1;
  int iVar2;
  int iVar3;
  undefined6 in_register_00000012;
  long in_FS_OFFSET;
  
  if (-0x7ffc < (int)CONCAT62(in_register_00000012,dep)) {
    __assert_fail("Consensus::ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentstatus.h"
                  ,0x10,
                  "bool DeploymentActiveAfter(const CBlockIndex *, const Consensus::Params &, Consensus::BuriedDeployment, VersionBitsCache &)"
                 );
  }
  if (pindexPrev == (CBlockIndex *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = pindexPrev->nHeight + 1;
  }
  if ((int)dep + 0x8000U < 5) {
    pCVar1 = (chainman->m_options).chainparams;
    switch((int)dep) {
    case -0x8000:
      iVar3 = (pCVar1->consensus).BIP34Height;
      break;
    case -0x7fff:
      iVar3 = (pCVar1->consensus).BIP65Height;
      break;
    case -0x7ffe:
      iVar3 = (pCVar1->consensus).BIP66Height;
      break;
    case -0x7ffd:
      iVar3 = (pCVar1->consensus).CSVHeight;
      break;
    case -0x7ffc:
      iVar3 = (pCVar1->consensus).SegwitHeight;
    }
  }
  else {
    iVar3 = 0x7fffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar3 <= iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentActiveAfter(const CBlockIndex* pindexPrev, const ChainstateManager& chainman, DEP dep)
{
    return DeploymentActiveAfter(pindexPrev, chainman.GetConsensus(), dep, chainman.m_versionbitscache);
}